

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workaround1209.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Workaround1209::RemoveOpUnreachableInLoops(Workaround1209 *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  undefined8 this_00;
  size_t func_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  Module *this_01;
  CFG *this_02;
  reference root;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var4;
  reference pvVar5;
  Instruction *pIVar6;
  IRContext *pIVar7;
  type inst;
  Operand *local_1c8;
  uint32_t local_19c;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_198
  ;
  allocator<spvtools::opt::Operand> local_18d;
  value_type local_18c;
  iterator local_188;
  undefined8 local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  Operand local_150;
  iterator local_120;
  _func_int **local_118;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_110;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_f8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_branch;
  undefined1 local_e8 [16];
  BasicBlock *bb;
  iterator __end3;
  iterator __begin3;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range3;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> loop_merges;
  undefined1 local_60 [8];
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> structured_order;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool modified;
  Workaround1209 *this_local;
  
  __range2._7_1_ = false;
  this_01 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_01);
  _func = Module::end(this_01);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    structured_order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node._M_size =
         (size_t)UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_)
    ;
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)local_60
        );
    this_02 = Pass::cfg(&this->super_Pass);
    func_00 = structured_order.
              super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl._M_node._M_size;
    join_0x00000010_0x00000000_ =
         opt::Function::begin
                   ((Function *)
                    structured_order.
                    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl._M_node._M_size);
    root = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                      &loop_merges.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node);
    CFG::ComputeStructuredOrder
              (this_02,(Function *)func_00,root,
               (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               local_60);
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
               &__range3);
    __end3 = std::__cxx11::
             list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                       ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)local_60);
    bb = (BasicBlock *)
         std::__cxx11::
         list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                   ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)local_60);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&bb), bVar1) {
      p_Var4 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end3);
      local_e8._8_8_ = p_Var4->_M_t;
      bVar1 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *
                    )&__range3);
      if (!bVar1) {
        uVar2 = BasicBlock::id((BasicBlock *)local_e8._8_8_);
        pvVar5 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&__range3);
        if (uVar2 == *pvVar5) {
          std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                    ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&__range3);
        }
      }
      BasicBlock::tail((BasicBlock *)local_e8);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_e8);
      OVar3 = opt::Instruction::opcode(pIVar6);
      if (OVar3 == OpUnreachable) {
        bVar1 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)&__range3);
        if (!bVar1) {
          pIVar7 = Pass::context(&this->super_Pass);
          BasicBlock::tail((BasicBlock *)&new_branch);
          pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)&new_branch);
          IRContext::KillInst(pIVar7,pIVar6);
          pIVar6 = (Instruction *)::operator_new(0x70);
          pIVar7 = Pass::context(&this->super_Pass);
          pvVar5 = std::
                   stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                   top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&__range3);
          local_18c = *pvVar5;
          local_188 = &local_18c;
          local_180 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_188;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list);
          Operand::Operand(&local_150,SPV_OPERAND_TYPE_ID,&local_178);
          local_120 = &local_150;
          local_118 = (_func_int **)0x1;
          std::allocator<spvtools::opt::Operand>::allocator(&local_18d);
          __l._M_len = (size_type)local_118;
          __l._M_array = local_120;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    (&local_110,__l,&local_18d);
          opt::Instruction::Instruction(pIVar6,pIVar7,OpBranch,0,0,&local_110);
          std::
          unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
          unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                    ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                      *)&local_f8,pIVar6);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_110);
          std::allocator<spvtools::opt::Operand>::~allocator(&local_18d);
          local_1c8 = (Operand *)&local_120;
          do {
            local_1c8 = local_1c8 + -1;
            Operand::~Operand(local_1c8);
          } while (local_1c8 != &local_150);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
          pIVar7 = Pass::context(&this->super_Pass);
          inst = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator*(&local_f8);
          IRContext::AnalyzeDefUse(pIVar7,inst);
          this_00 = local_e8._8_8_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_198,&local_f8);
          BasicBlock::AddInstruction((BasicBlock *)this_00,&local_198);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_198);
          __range2._7_1_ = true;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_f8);
        }
      }
      else {
        pIVar6 = BasicBlock::GetLoopMergeInst((BasicBlock *)local_e8._8_8_);
        if (pIVar6 != (Instruction *)0x0) {
          local_19c = BasicBlock::MergeBlockIdIfAny((BasicBlock *)local_e8._8_8_);
          std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                    ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&__range3,&local_19c);
        }
      }
      std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end3);
    }
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &__range3);
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    ~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
          local_60);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  return __range2._7_1_;
}

Assistant:

bool Workaround1209::RemoveOpUnreachableInLoops() {
  bool modified = false;
  for (auto& func : *get_module()) {
    std::list<BasicBlock*> structured_order;
    cfg()->ComputeStructuredOrder(&func, &*func.begin(), &structured_order);

    // Keep track of the loop merges.  The top of the stack will always be the
    // loop merge for the loop that immediately contains the basic block being
    // processed.
    std::stack<uint32_t> loop_merges;
    for (BasicBlock* bb : structured_order) {
      if (!loop_merges.empty() && bb->id() == loop_merges.top()) {
        loop_merges.pop();
      }

      if (bb->tail()->opcode() == spv::Op::OpUnreachable) {
        if (!loop_merges.empty()) {
          // We found an OpUnreachable inside a loop.
          // Replace it with an unconditional branch to the loop merge.
          context()->KillInst(&*bb->tail());
          std::unique_ptr<Instruction> new_branch(
              new Instruction(context(), spv::Op::OpBranch, 0, 0,
                              {{spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                                {loop_merges.top()}}}));
          context()->AnalyzeDefUse(&*new_branch);
          bb->AddInstruction(std::move(new_branch));
          modified = true;
        }
      } else {
        if (bb->GetLoopMergeInst()) {
          loop_merges.push(bb->MergeBlockIdIfAny());
        }
      }
    }
  }
  return modified;
}